

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O0

void __thiscall
Number_N10DefaultBase8_Test<char>::Number_N10DefaultBase8_Test
          (Number_N10DefaultBase8_Test<char> *this)

{
  Number_N10DefaultBase8_Test<char> *this_local;
  
  anon_unknown.dwarf_b72d1::Number<char>::Number(&this->super_Number<char>);
  (this->super_Number<char>).super_Test._vptr_Test =
       (_func_int **)&PTR__Number_N10DefaultBase8_Test_002ed250;
  return;
}

Assistant:

TYPED_TEST (Number, N10DefaultBase8) {
    pstore::dump::number_base::oct ();
    pstore::dump::number_long v (10);
    v.write (this->out_);
    auto const & actual = this->out_.str ();
    auto const & expected = convert<TypeParam> ("012");
    EXPECT_EQ (expected, actual);
}